

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-writer-spec.cc
# Opt level: O1

void __thiscall
wabt::anon_unknown_1::BinaryWriterSpec::BinaryWriterSpec
          (BinaryWriterSpec *this,Stream *json_stream,
          WriteBinarySpecStreamFactory *module_stream_factory,string_view source_filename,
          string_view module_filename_noext,WriteBinaryOptions *options)

{
  undefined1 local_38 [8];
  string_view source_filename_local;
  
  source_filename_local.data_ = (char *)source_filename.size_;
  local_38 = (undefined1  [8])source_filename.data_;
  this->script_ = (Script *)0x0;
  this->json_stream_ = json_stream;
  std::function<wabt::Stream_*(wabt::string_view)>::function
            (&this->module_stream_factory_,module_stream_factory);
  string_view::operator_cast_to_string(&this->source_filename_,(string_view *)local_38);
  string_view::operator_cast_to_string(&this->module_filename_noext_,&module_filename_noext);
  this->options_ = options;
  (this->result_).enum_ = Ok;
  this->num_modules_ = 0;
  return;
}

Assistant:

BinaryWriterSpec::BinaryWriterSpec(
    Stream* json_stream,
    WriteBinarySpecStreamFactory module_stream_factory,
    string_view source_filename,
    string_view module_filename_noext,
    const WriteBinaryOptions& options)
    : json_stream_(json_stream),
      module_stream_factory_(module_stream_factory),
      source_filename_(source_filename),
      module_filename_noext_(module_filename_noext),
      options_(options) {}